

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::CumulativeReporterBase
          (CumulativeReporterBase *this,ReporterConfig *_config)

{
  ReporterConfig *_config_local;
  CumulativeReporterBase *this_local;
  
  ReporterBase::ReporterBase(&this->super_ReporterBase,_config);
  (this->super_ReporterBase).super_IEventListener._vptr_IEventListener =
       (_func_int **)&PTR__CumulativeReporterBase_005010c0;
  this->m_shouldStoreSuccesfulAssertions = true;
  this->m_shouldStoreFailedAssertions = true;
  Detail::
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
  ::unique_ptr(&this->m_testRun,(nullptr_t)0x0);
  std::
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::vector(&this->m_testCases);
  Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::unique_ptr
            (&this->m_rootSection,(nullptr_t)0x0);
  this->m_deepestSection = (SectionNode *)0x0;
  std::
  vector<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
  ::vector(&this->m_sectionStack);
  return;
}

Assistant:

CumulativeReporterBase(ReporterConfig&& _config):
            ReporterBase(CATCH_MOVE(_config))
        {}